

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O2

bool __thiscall
duckdb::WindowDistinctSortTree::TryNextRun
          (WindowDistinctSortTree *this,idx_t *level_idx,idx_t *run_idx)

{
  mutex *__mutex;
  atomic<unsigned_long> *paVar1;
  pointer puVar2;
  pointer puVar3;
  idx_t iVar4;
  reference pvVar5;
  reference pvVar6;
  Elements *pEVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar10;
  MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
  *this_00;
  
  __mutex = &(this->
             super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
             ).build_lock;
  ::std::mutex::lock(__mutex);
  if ((this->super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
      ).build_level.super___atomic_base<unsigned_long>._M_i <
      (ulong)(((long)(this->
                     super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
                     ).tree.
                     super_vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                     .
                     super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->
                    super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
                    ).tree.
                    super_vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                    .
                    super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x30)) {
    uVar10 = (this->
             super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
             ).build_num_runs;
    if ((this->
        super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>).
        build_complete.super___atomic_base<unsigned_long>._M_i < uVar10) {
      uVar8 = (this->
              super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
              ).build_run;
    }
    else {
      this_00 = &this->gdastate->zipped_tree;
      pvVar5 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
               ::get<true>((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                            *)this,(this->
                                   super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
                                   ).build_level.super___atomic_base<unsigned_long>._M_i);
      pvVar6 = vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
               ::get<true>(&this_00->tree,
                           (this->
                           super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
                           ).build_level.super___atomic_base<unsigned_long>._M_i);
      ::std::swap<duckdb::vector<unsigned_long,true>>(&pvVar5->second,&pvVar6->second);
      LOCK();
      paVar1 = &(this->
                super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
                ).build_level;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      if ((ulong)(((long)(this->
                         super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
                         ).tree.
                         super_vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                         .
                         super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->
                        super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
                        ).tree.
                        super_vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                        .
                        super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x30) <=
          (this->
          super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>).
          build_level.super___atomic_base<unsigned_long>._M_i) {
        ::std::
        vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
        ::clear((vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                 *)this_00);
        goto LAB_015c1fb3;
      }
      pEVar7 = MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>::
               LowestLevel(&this->
                            super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
                          );
      puVar2 = (pEVar7->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar3 = (pEVar7->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = (this->
               super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
               ).build_run_length * 0x20;
      (this->super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
      ).build_run_length = uVar10;
      uVar8 = 0;
      uVar10 = ((uVar10 + ((long)puVar2 - (long)puVar3 >> 3)) - 1) / uVar10;
      (this->super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
      ).build_num_runs = uVar10;
      (this->super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
      ).build_run = 0;
      LOCK();
      (this->super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
      ).build_complete.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
    }
    if (uVar8 < uVar10) {
      *level_idx = (this->
                   super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
                   ).build_level.super___atomic_base<unsigned_long>._M_i;
      iVar4 = (this->
              super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
              ).build_run;
      (this->super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
      ).build_run = iVar4 + 1;
      *run_idx = iVar4;
      bVar9 = true;
      goto LAB_015c1fb5;
    }
  }
LAB_015c1fb3:
  bVar9 = false;
LAB_015c1fb5:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return bVar9;
}

Assistant:

bool WindowDistinctSortTree::TryNextRun(idx_t &level_idx, idx_t &run_idx) {
	const auto fanout = FANOUT;

	lock_guard<mutex> stage_guard(build_lock);

	//	Verify we are not done
	if (build_level >= tree.size()) {
		return false;
	}

	// Finished with this level?
	if (build_complete >= build_num_runs) {
		auto &zipped_tree = gdastate.zipped_tree;
		std::swap(tree[build_level].second, zipped_tree.tree[build_level].second);

		++build_level;
		if (build_level >= tree.size()) {
			zipped_tree.tree.clear();
			return false;
		}

		const auto count = LowestLevel().size();
		build_run_length *= fanout;
		build_num_runs = (count + build_run_length - 1) / build_run_length;
		build_run = 0;
		build_complete = 0;
	}

	// If all runs are in flight,
	// yield until the next level is ready
	if (build_run >= build_num_runs) {
		return false;
	}

	level_idx = build_level;
	run_idx = build_run++;

	return true;
}